

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

CustomModel_ParametersEntry_DoNotUse *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::CustomModel_ParametersEntry_DoNotUse>(Arena *arena)

{
  CustomModel_ParametersEntry_DoNotUse *this;
  
  if (arena == (Arena *)0x0) {
    this = (CustomModel_ParametersEntry_DoNotUse *)operator_new(0x28);
    CoreML::Specification::CustomModel_ParametersEntry_DoNotUse::
    CustomModel_ParametersEntry_DoNotUse(this,(Arena *)0x0);
  }
  else {
    this = (CustomModel_ParametersEntry_DoNotUse *)
           AllocateAlignedWithHook
                     (arena,0x28,
                      (type_info *)
                      &CoreML::Specification::CustomModel_ParametersEntry_DoNotUse::typeinfo);
    CoreML::Specification::CustomModel_ParametersEntry_DoNotUse::
    CustomModel_ParametersEntry_DoNotUse(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }